

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

bool __thiscall
ON_RevSurface::GetBBox(ON_RevSurface *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  ON_Line *this_00;
  ON_Interval *this_01;
  double *pdVar1;
  ON_3dVector *this_02;
  bool bVar2;
  long lVar3;
  long lVar4;
  ON_Plane *pOVar5;
  ON_Arc *pOVar6;
  ON_BoundingBox *this_03;
  ON_RevSurface *ptr;
  byte bVar7;
  double dVar8;
  double dVar9;
  ON_BoundingBox local_200;
  double *local_1d0;
  ON_RevSurface *local_1c8;
  double *local_1c0;
  ON_BoundingBox *local_1b8;
  long local_1b0;
  double t;
  ON_3dPointArray corners;
  ON_3dPoint P;
  ON_BoundingBox bbox;
  ON_Arc arc;
  ON_BoundingBox abox;
  ON_BoundingBox cbox;
  
  bVar7 = 0;
  this_03 = &this->m_bbox;
  bVar2 = ON_BoundingBox::IsValid(this_03);
  if (!bVar2) {
    ON_BoundingBox::ON_BoundingBox(&bbox);
    ON_BoundingBox::ON_BoundingBox(&cbox);
    ON_BoundingBox::ON_BoundingBox(&abox);
    bVar2 = ON_Geometry::GetBoundingBox(&this->m_curve->super_ON_Geometry,&cbox,false);
    if (!bVar2) {
      return false;
    }
    local_1b8 = this_03;
    ON_3dPointArray::ON_3dPointArray(&corners);
    ON_BoundingBox::GetCorners(&cbox,&corners);
    pOVar5 = &ON_Plane::World_xy;
    pOVar6 = &arc;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pOVar6->super_ON_Circle).plane.origin.x = (pOVar5->origin).x;
      pOVar5 = (ON_Plane *)((long)pOVar5 + ((ulong)bVar7 * -2 + 1) * 8);
      pOVar6 = (ON_Arc *)((long)pOVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    arc.super_ON_Circle.radius = 1.0;
    arc.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
    arc.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
    this_00 = &this->m_axis;
    ON_Line::Tangent((ON_3dVector *)&local_200,this_00);
    arc.super_ON_Circle.plane.zaxis.z = local_200.m_min.z;
    arc.super_ON_Circle.plane.zaxis.x = local_200.m_min.x;
    arc.super_ON_Circle.plane.zaxis.y = local_200.m_min.y;
    this_01 = &this->m_angle;
    local_1d0 = boxmin;
    local_1c8 = this;
    local_1c0 = boxmax;
    dVar8 = ON_Interval::operator[](this_01,1);
    dVar9 = ON_Interval::operator[](this_01,0);
    ON_Arc::SetAngleRadians(&arc,dVar8 - dVar9);
    this_02 = &arc.super_ON_Circle.plane.xaxis;
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < corners.super_ON_SimpleArray<ON_3dPoint>.m_count; lVar4 = lVar4 + 1) {
      pdVar1 = (double *)((long)&(corners.super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar3);
      P.x = *pdVar1;
      P.y = pdVar1[1];
      P.z = *(double *)((long)&(corners.super_ON_SimpleArray<ON_3dPoint>.m_a)->z + lVar3);
      ON_BoundingBox::Set(&abox,&P,0);
      bVar2 = ON_Line::ClosestPointTo(this_00,&P,&t);
      if (bVar2) {
        local_1b0 = lVar3;
        ON_Line::PointAt(&local_200.m_min,this_00,t);
        arc.super_ON_Circle.plane.origin.z = local_200.m_min.z;
        arc.super_ON_Circle.plane.origin.x = local_200.m_min.x;
        arc.super_ON_Circle.plane.origin.y = local_200.m_min.y;
        ON_3dPoint::operator-((ON_3dVector *)&local_200,&P,(ON_3dPoint *)&arc);
        arc.super_ON_Circle.plane.xaxis.z = local_200.m_min.z;
        arc.super_ON_Circle.plane.xaxis.x = local_200.m_min.x;
        arc.super_ON_Circle.plane.xaxis.y = local_200.m_min.y;
        ON_BoundingBox::Set(&abox,(ON_3dPoint *)&arc,1);
        lVar3 = local_1b0;
        arc.super_ON_Circle.radius = ON_3dVector::Length(this_02);
        bVar2 = ON_3dVector::Unitize(this_02);
        if ((bVar2) &&
           (dVar8 = ON_3dVector::operator*(this_02,&arc.super_ON_Circle.plane.zaxis),
           ABS(dVar8) <= 0.0001)) {
          ON_CrossProduct((ON_3dVector *)&local_200,&arc.super_ON_Circle.plane.zaxis,this_02);
          arc.super_ON_Circle.plane.yaxis.z = local_200.m_min.z;
          arc.super_ON_Circle.plane.yaxis.x = local_200.m_min.x;
          arc.super_ON_Circle.plane.yaxis.y = local_200.m_min.y;
          bVar2 = ON_3dVector::Unitize(&arc.super_ON_Circle.plane.yaxis);
          if (bVar2) {
            ON_Plane::UpdateEquation((ON_Plane *)&arc);
            dVar8 = ON_Interval::operator[](this_01,0);
            ON_Plane::Rotate((ON_Plane *)&arc,dVar8,&arc.super_ON_Circle.plane.zaxis);
            bVar2 = ON_Arc::IsValid(&arc);
            if (bVar2) {
              ON_Arc::BoundingBox(&local_200,&arc);
              abox.m_max.y = local_200.m_max.y;
              abox.m_max.z = local_200.m_max.z;
              abox.m_min.z = local_200.m_min.z;
              abox.m_max.x = local_200.m_max.x;
              abox.m_min.x = local_200.m_min.x;
              abox.m_min.y = local_200.m_min.y;
            }
          }
        }
      }
      ON_BoundingBox::Union(&bbox,&abox);
      lVar3 = lVar3 + 0x18;
    }
    bVar2 = ON_BoundingBox::IsValid(&bbox);
    this_03 = local_1b8;
    boxmax = local_1c0;
    this = local_1c8;
    boxmin = local_1d0;
    if (bVar2) {
      (local_1b8->m_max).y = bbox.m_max.y;
      (local_1b8->m_max).z = bbox.m_max.z;
      (local_1b8->m_min).z = bbox.m_min.z;
      (local_1b8->m_max).x = bbox.m_max.x;
      (local_1b8->m_min).x = bbox.m_min.x;
      (local_1b8->m_min).y = bbox.m_min.y;
    }
    ON_Plane::~ON_Plane((ON_Plane *)&arc);
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&corners.super_ON_SimpleArray<ON_3dPoint>);
  }
  if (boxmin != (double *)0x0) {
    dVar8 = (this_03->m_min).x;
    if (!bGrowBox) {
      *boxmin = dVar8;
      boxmin[1] = (this->m_bbox).m_min.y;
      boxmin[2] = (this->m_bbox).m_min.z;
      if (boxmax == (double *)0x0) {
        return true;
      }
      goto LAB_005ac3c5;
    }
    if (dVar8 < *boxmin) {
      *boxmin = dVar8;
    }
    dVar8 = (this->m_bbox).m_min.y;
    if (dVar8 < boxmin[1]) {
      boxmin[1] = dVar8;
    }
    dVar8 = (this->m_bbox).m_min.z;
    if (dVar8 < boxmin[2]) {
      boxmin[2] = dVar8;
    }
  }
  if (boxmax == (double *)0x0) {
    return true;
  }
  if (bGrowBox) {
    dVar8 = (this->m_bbox).m_max.x;
    if (*boxmax <= dVar8 && dVar8 != *boxmax) {
      *boxmax = dVar8;
    }
    dVar8 = (this->m_bbox).m_max.y;
    if (boxmax[1] <= dVar8 && dVar8 != boxmax[1]) {
      boxmax[1] = dVar8;
    }
    dVar8 = (this->m_bbox).m_max.z;
    if (boxmax[2] <= dVar8 && dVar8 != boxmax[2]) {
      boxmax[2] = dVar8;
      return true;
    }
    return true;
  }
LAB_005ac3c5:
  *boxmax = (this->m_bbox).m_max.x;
  boxmax[1] = (this->m_bbox).m_max.y;
  boxmax[2] = (this->m_bbox).m_max.z;
  return true;
}

Assistant:

bool ON_RevSurface::GetBBox(    // returns true if successful
       double* boxmin,  // boxmin[dim]
       double* boxmax,  // boxmax[dim]
       bool bGrowBox    // true means grow box
       ) const
{
  bool rc = m_bbox.IsValid();

  if ( !rc )
  {
    ON_BoundingBox bbox, cbox, abox;
    rc = m_curve->GetBoundingBox( cbox );
    if (rc)
    {
      //Dec 16 2010 - Chuck - if the angle range does not include 0, m_curve is not part of the surface.
      //bbox = cbox;

      ON_3dPointArray corners;
      cbox.GetCorners(corners);
      ON_3dPoint P;
      ON_Arc arc;
      arc.plane.zaxis = m_axis.Tangent();
      arc.SetAngleRadians(m_angle[1] - m_angle[0]);
      int i;
      double t;
      for ( i = 0; i < corners.Count(); i++ )
      {
        P = corners[i];
        abox.Set(P,false);
        while( m_axis.ClosestPointTo(P,&t) ) // not a loop - used for flow control
        {
          // If we cannot construct a valid arc, then P and the point on the axis
          // are added to the bounding box.  One case where this happens is when
          // P is on the axis of revolution.  See bug 84354.

          arc.plane.origin = m_axis.PointAt(t);
          arc.plane.xaxis = P-arc.plane.origin;
          abox.Set(arc.plane.origin,true);
          arc.radius = arc.plane.xaxis.Length();
          if ( !arc.plane.xaxis.Unitize() )
            break;
          double dot = arc.plane.xaxis*arc.plane.zaxis;
          if ( fabs(dot) > 0.0001 )
            break; 
          arc.plane.yaxis = ON_CrossProduct(arc.plane.zaxis,arc.plane.xaxis);
          if ( !arc.plane.yaxis.Unitize() )
            break;
          arc.plane.UpdateEquation();
          arc.plane.Rotate( m_angle[0], arc.plane.zaxis );
          if ( !arc.IsValid() )
            break;
          abox = arc.BoundingBox();
          break;
        }
        bbox.Union(abox);
      }

      if ( bbox.IsValid() )
      {
        ON_RevSurface* ptr = const_cast<ON_RevSurface*>(this);
        ptr->m_bbox = bbox;
        rc = true;
      }
    }
  }

  if ( rc )
  {
    if ( boxmin )
    {
      if (bGrowBox){
        if (m_bbox.m_min.x < boxmin[0]) boxmin[0] = m_bbox.m_min.x;
        if (m_bbox.m_min.y < boxmin[1]) boxmin[1] = m_bbox.m_min.y;
        if (m_bbox.m_min.z < boxmin[2]) boxmin[2] = m_bbox.m_min.z;
      }
      else {
        boxmin[0] = m_bbox.m_min.x;
        boxmin[1] = m_bbox.m_min.y;
        boxmin[2] = m_bbox.m_min.z;
      }
    }
    if ( boxmax )
    {
      if (bGrowBox){
        if (m_bbox.m_max.x > boxmax[0]) boxmax[0] = m_bbox.m_max.x;
        if (m_bbox.m_max.y > boxmax[1]) boxmax[1] = m_bbox.m_max.y;
        if (m_bbox.m_max.z > boxmax[2]) boxmax[2] = m_bbox.m_max.z;
      }
      else {
        boxmax[0] = m_bbox.m_max.x;
        boxmax[1] = m_bbox.m_max.y;
        boxmax[2] = m_bbox.m_max.z;
      }
    }
  }

  return rc;
}